

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::
     PrintTupleTo<std::tuple<unsigned_char,void(*)(short_const*,int*,int,txfm_param*)>,2ul>
               (_func_void_short_ptr_int_ptr_int_txfm_param_ptr **t,ostream *param_2)

{
  UniversalPrinter<unsigned_char>::Print((uchar *)(t + 1),param_2);
  std::operator<<(param_2,", ");
  PrintWithFallback<void(*)(short_const*,int*,int,txfm_param*)>(t,param_2);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}